

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O3

void __thiscall
wasm::TypeMapper::modifyContinuation(TypeMapper *this,HeapType oldType,Continuation *continuation)

{
  const_iterator cVar1;
  key_type *pkVar2;
  HeapType local_30;
  HeapType local_28;
  HeapType oldType_local;
  
  local_28.id = oldType.id;
  local_30.id = (uintptr_t)HeapType::getContinuation(&local_28);
  cVar1 = std::
          _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this->mapping->_M_h,&local_30);
  pkVar2 = (key_type *)
           ((long)cVar1.
                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>.
                  _M_cur + 0x10);
  if (cVar1.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>._M_cur
      == (__node_type *)0x0) {
    pkVar2 = &local_30;
  }
  (continuation->type).id = pkVar2->id;
  return;
}

Assistant:

void modifyContinuation(HeapType oldType,
                          Continuation& continuation) override {
    continuation.type = getNewHeapType(oldType.getContinuation().type);
  }